

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O0

TFunction * __thiscall
glslang::HlslParseContext::makeConstructorCall(HlslParseContext *this,TSourceLoc *loc,TType *type)

{
  char *pcVar1;
  pool_allocator<char> local_60;
  undefined1 local_58 [8];
  TString empty;
  TOperator op;
  TType *type_local;
  TSourceLoc *loc_local;
  HlslParseContext *this_local;
  
  empty.field_2._12_4_ =
       TIntermediate::mapTypeToConstructorOp
                 ((this->super_TParseContextBase).super_TParseVersions.intermediate,type);
  if (empty.field_2._12_4_ == EOpNull) {
    pcVar1 = TType::getBasicString(type);
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,loc,"cannot construct this type",pcVar1,"");
    this_local = (HlslParseContext *)0x0;
  }
  else {
    pool_allocator<char>::pool_allocator(&local_60);
    pcVar1 = "";
    std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
    basic_string<glslang::std::allocator<char>>
              ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)local_58,
               "",&local_60);
    this_local = (HlslParseContext *)TSymbol::operator_new((TSymbol *)0x160,(size_t)pcVar1);
    TFunction::TFunction((TFunction *)this_local,(TString *)local_58,type,empty.field_2._12_4_);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
    ~basic_string((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                  local_58);
  }
  return (TFunction *)this_local;
}

Assistant:

TFunction* HlslParseContext::makeConstructorCall(const TSourceLoc& loc, const TType& type)
{
    TOperator op = intermediate.mapTypeToConstructorOp(type);

    if (op == EOpNull) {
        error(loc, "cannot construct this type", type.getBasicString(), "");
        return nullptr;
    }

    TString empty("");

    return new TFunction(&empty, type, op);
}